

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

bufsize_t __thiscall LdConfigDirWrapper::getHdrDefinedSize(LdConfigDirWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DWORD *sizePtr;
  IMAGE_LOAD_CONFIG_DIRECTORY64 ld_1;
  IMAGE_LOAD_CONFIG_DIRECTORY32 ld;
  offset_t offset;
  CustomException anon_var_0;
  offset_t raw;
  offset_t rva;
  LdConfigDirWrapper *this_local;
  
  DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  iVar2 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
            [0x1a])();
  if (CONCAT44(extraout_var,iVar2) == -1) {
    this_local = (LdConfigDirWrapper *)0x0;
  }
  else {
    ld.GuardEHContinuationTable = 0xffffffff;
    ld.GuardEHContinuationCount = 0xffffffff;
    iVar3 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
              [0xb])();
    if (iVar3 == 0x20) {
      memset(&ld_1.GuardEHContinuationCount,0,0xac);
      ld.GuardEHContinuationTable = 0;
      ld.GuardEHContinuationCount = 0;
    }
    else {
      iVar3 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                  super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
                [0xb])();
      if (iVar3 == 0x40) {
        memset((void *)((long)&sizePtr + 4),0,0x118);
        ld.GuardEHContinuationTable = 0;
        ld.GuardEHContinuationCount = 0;
      }
    }
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[7])
                      (pEVar1,CONCAT44(extraout_var,iVar2) + ld._164_8_,4,0);
    if ((uint *)CONCAT44(extraout_var_00,iVar2) == (uint *)0x0) {
      this_local = (LdConfigDirWrapper *)0x0;
    }
    else {
      this_local = (LdConfigDirWrapper *)(ulong)*(uint *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  return (bufsize_t)this_local;
}

Assistant:

bufsize_t LdConfigDirWrapper::getHdrDefinedSize()
{
    const offset_t rva = getDirEntryAddress();
    offset_t raw = INVALID_ADDR;
    try {
        raw = m_Exe->rvaToRaw(rva);
    } catch (CustomException) {
        raw = INVALID_ADDR;
    }
    if (raw == INVALID_ADDR) return 0;
    
    offset_t offset = INVALID_ADDR;
    
    if (m_Exe->getBitMode() == Executable::BITS_32) {
        pe::IMAGE_LOAD_CONFIG_DIRECTORY32 ld = { 0 };
        offset = getStructFieldOffset(ld, Size);

    } else if (m_Exe->getBitMode() == Executable::BITS_64) {
        pe::IMAGE_LOAD_CONFIG_DIRECTORY64 ld = { 0 };
        offset = getStructFieldOffset(ld, Size);
    }
    DWORD* sizePtr = (DWORD*) m_Exe->getContentAt((raw + offset), sizeof(DWORD));
    if (!sizePtr) return 0;
    return bufsize_t(*sizePtr);
}